

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O2

int cd_match_expression_finalise(parser_info *info)

{
  char *pcVar1;
  node_info *pnVar2;
  int iVar3;
  size_t sVar4;
  coda_expression_type result_type;
  coda_expression *expr;
  
  pcVar1 = info->node->char_data;
  if (pcVar1 != (char *)0x0) {
    sVar4 = strlen(pcVar1);
    iVar3 = is_whitespace(pcVar1,(int)sVar4);
    pcVar1 = info->node->char_data;
    if (iVar3 == 0) {
      if (pcVar1 != (char *)0x0) {
        iVar3 = coda_expression_from_string(pcVar1,&expr);
        if (iVar3 != 0) {
          return -1;
        }
        free(info->node->char_data);
        pnVar2 = info->node;
        pnVar2->char_data = (char *)0x0;
        *(coda_expression **)((long)pnVar2->data + 8) = expr;
        iVar3 = coda_expression_get_type(expr,&result_type);
        if (iVar3 != 0) {
          return -1;
        }
        if (result_type != coda_expression_boolean) {
          coda_set_error(-400,"not a boolean expression");
          return -1;
        }
        return 0;
      }
    }
    else {
      free(pcVar1);
      info->node->char_data = (char *)0x0;
    }
  }
  coda_set_error(-400,"empty detection expression");
  return -1;
}

Assistant:

static int cd_match_expression_finalise(parser_info *info)
{
    coda_expression_type result_type;
    coda_expression *expr;

    if (info->node->char_data != NULL)
    {
        if (is_whitespace(info->node->char_data, (int)strlen(info->node->char_data)))
        {
            free(info->node->char_data);
            info->node->char_data = NULL;
        }
    }
    if (info->node->char_data == NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "empty detection expression");
        return -1;
    }

    if (coda_expression_from_string(info->node->char_data, &expr) != 0)
    {
        return -1;
    }
    free(info->node->char_data);
    info->node->char_data = NULL;
    ((coda_detection_rule_entry *)info->node->data)->expression = expr;
    if (coda_expression_get_type(expr, &result_type) != 0)
    {
        return -1;
    }
    if (result_type != coda_expression_boolean)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "not a boolean expression");
        return -1;
    }

    return 0;
}